

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void munge_xlstring(char *dest,char *src,int n)

{
  bool bVar1;
  int local_20;
  int i;
  int n_local;
  char *src_local;
  char *dest_local;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if (local_20 < n + -1) {
      bVar1 = src[local_20] != '\0';
    }
    if (!bVar1) break;
    if ((src[local_20] == ':') || (src[local_20] == '\n')) {
      dest[local_20] = '_';
    }
    else {
      dest[local_20] = src[local_20];
    }
    local_20 = local_20 + 1;
  }
  dest[local_20] = '\0';
  return;
}

Assistant:

void munge_xlstring(char *dest, const char *src, int n)
{
    int i;

    for (i = 0; i < n - 1 && src[i]; i++) {
	if (src[i] == SEPC || src[i] == '\n') {
	    dest[i] = '_';
	} else {
	    dest[i] = src[i];
	}
    }

    dest[i] = '\0';
}